

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int remain;
  uint uVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  uint uVar21;
  uint h;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  void *local_70;
  
  uVar19._0_4_ = bottom_blob->w;
  uVar19._4_4_ = bottom_blob->h;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar19;
  uVar21 = this->output_width;
  h = this->output_height;
  bVar20 = bottom_blob->dims == 1;
  if (!bVar20) {
    uVar19 = (ulong)(uint)bottom_blob->c;
  }
  uVar8 = (uint)bVar20;
  auVar27._0_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar27._4_4_ = (int)(uVar8 << 0x1f) >> 0x1f;
  auVar27._8_8_ = 0;
  auVar28._0_4_ = auVar27._0_4_ >> 0x1f;
  auVar28._4_4_ = auVar27._4_4_ >> 0x1f;
  auVar28._8_8_ = 0;
  auVar28 = auVar28 | ~auVar27 & auVar26;
  auVar23._0_4_ = -(uint)(uVar21 == 0);
  auVar23._4_4_ = -(uint)(uVar21 == 0);
  auVar23._8_4_ = -(uint)(h == 0);
  auVar23._12_4_ = -(uint)(h == 0);
  iVar9 = movmskpd(uVar8,auVar23);
  uVar8 = auVar28._0_4_;
  uVar29 = auVar28._4_4_;
  if (iVar9 != 0) {
    uVar2 = this->width_scale;
    uVar3 = this->height_scale;
    uVar21 = (uint)((float)uVar2 * (float)(int)uVar8);
    h = (uint)((float)uVar3 * (float)(int)uVar29);
  }
  auVar24._0_4_ = -(uint)(uVar21 == uVar8);
  auVar24._4_4_ = auVar24._0_4_;
  auVar24._8_4_ = -(uint)(h == uVar29);
  auVar24._12_4_ = -(uint)(h == uVar29);
  iVar9 = movmskpd(iVar9,auVar24);
  if (iVar9 == 3) {
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if ((*piVar4 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->elemsize = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      iVar9 = bottom_blob->w;
      iVar18 = bottom_blob->h;
      iVar11 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar9;
      top_blob->h = iVar18;
      top_blob->c = iVar11;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  iVar18 = (int)uVar19;
  auVar25._0_4_ = -(uint)(top_blob->dims == 3);
  auVar25._4_4_ = -(uint)(uVar21 == top_blob->w);
  auVar25._8_4_ = -(uint)(h == top_blob->h);
  auVar25._12_4_ = -(uint)(iVar18 == top_blob->c);
  iVar9 = movmskps(iVar9,auVar25);
  if ((iVar9 == 0xf) && (top_blob->elemsize == 4)) {
    local_70 = top_blob->data;
    if (local_70 == (void *)0x0) {
      return -100;
    }
    sVar17 = top_blob->cstep;
    iVar9 = iVar18;
  }
  else {
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if ((*piVar4 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = uVar21;
    top_blob->h = h;
    top_blob->c = iVar18;
    sVar17 = (long)(int)(h * uVar21) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = sVar17;
    lVar12 = (long)iVar18 * sVar17;
    if (lVar12 == 0) {
      return -100;
    }
    pvVar10 = malloc(lVar12 * 4 + 0x1c);
    local_70 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)local_70 - 8) = pvVar10;
    top_blob->data = local_70;
    piVar4 = (int *)((long)local_70 + lVar12 * 4);
    top_blob->refcount = piVar4;
    *piVar4 = 1;
    iVar9 = top_blob->c;
  }
  auVar27 = _DAT_00134480;
  auVar23 = _DAT_00134470;
  auVar26 = _DAT_00134400;
  if ((long)iVar9 * sVar17 == 0) {
    return -100;
  }
  if (bottom_blob->dims == 1) {
    if (0 < iVar18) {
      uVar21 = top_blob->h * top_blob->w;
      pvVar10 = bottom_blob->data;
      lVar12 = (ulong)uVar21 - 1;
      auVar22._8_4_ = (int)lVar12;
      auVar22._0_8_ = lVar12;
      auVar22._12_4_ = (int)((ulong)lVar12 >> 0x20);
      lVar12 = (long)top_blob->data + 0xc;
      sVar5 = top_blob->elemsize;
      uVar14 = 0;
      auVar22 = auVar22 ^ _DAT_00134400;
      do {
        if (0 < (int)uVar21) {
          uVar1 = *(undefined4 *)((long)pvVar10 + uVar14 * 4);
          uVar15 = 0;
          do {
            auVar30._8_4_ = (int)uVar15;
            auVar30._0_8_ = uVar15;
            auVar30._12_4_ = (int)(uVar15 >> 0x20);
            auVar28 = (auVar30 | auVar27) ^ auVar26;
            iVar9 = auVar22._4_4_;
            if ((bool)(~(iVar9 < auVar28._4_4_ ||
                        auVar22._0_4_ < auVar28._0_4_ && auVar28._4_4_ == iVar9) & 1)) {
              *(undefined4 *)(lVar12 + -0xc + uVar15 * 4) = uVar1;
            }
            if (auVar28._12_4_ <= auVar22._12_4_ &&
                (auVar28._8_4_ <= auVar22._8_4_ || auVar28._12_4_ != auVar22._12_4_)) {
              *(undefined4 *)(lVar12 + -8 + uVar15 * 4) = uVar1;
            }
            auVar28 = (auVar30 | auVar23) ^ auVar26;
            iVar18 = auVar28._4_4_;
            if (iVar18 <= iVar9 && (iVar18 != iVar9 || auVar28._0_4_ <= auVar22._0_4_)) {
              *(undefined4 *)(lVar12 + -4 + uVar15 * 4) = uVar1;
              *(undefined4 *)(lVar12 + uVar15 * 4) = uVar1;
            }
            uVar15 = uVar15 + 4;
          } while ((uVar21 + 3 & 0xfffffffc) != uVar15);
        }
        uVar14 = uVar14 + 1;
        lVar12 = lVar12 + sVar17 * sVar5;
      } while (uVar14 != (uVar19 & 0xffffffff));
    }
  }
  else if (this->resize_type == 2) {
    resize_bilinear(bottom_blob,top_blob,uVar21,h);
  }
  else {
    if (this->resize_type != 1) {
      forward();
      return -0xe9;
    }
    if (0 < iVar18) {
      pvVar10 = bottom_blob->data;
      sVar5 = bottom_blob->cstep;
      sVar6 = bottom_blob->elemsize;
      sVar7 = top_blob->elemsize;
      uVar14 = 0;
      do {
        if (0 < (int)h) {
          uVar15 = 0;
          pvVar13 = local_70;
          do {
            if (0 < (int)uVar21) {
              iVar9 = (int)((float)(int)uVar15 / this->height_scale);
              if ((int)(uVar29 - 1) < iVar9) {
                iVar9 = uVar29 - 1;
              }
              uVar16 = 0;
              do {
                iVar11 = (int)((float)(int)uVar16 / this->width_scale);
                iVar18 = uVar8 - 1;
                if (iVar11 <= (int)(uVar8 - 1)) {
                  iVar18 = iVar11;
                }
                *(undefined4 *)((long)pvVar13 + uVar16 * 4) =
                     *(undefined4 *)
                      ((long)pvVar10 +
                      (long)(int)(iVar18 + iVar9 * uVar8) * 4 + sVar5 * sVar6 * uVar14);
                uVar16 = uVar16 + 1;
              } while (uVar21 != uVar16);
            }
            uVar15 = uVar15 + 1;
            pvVar13 = (void *)((long)pvVar13 + (ulong)uVar21 * 4);
          } while (uVar15 != h);
        }
        uVar14 = uVar14 + 1;
        local_70 = (void *)((long)local_70 + sVar17 * sVar7);
      } while (uVar14 != (uVar19 & 0xffffffff));
      return 0;
    }
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)//nearest
    {
        #pragma omp parallel for
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        resize_bilinear(bottom_blob, top_blob, ow, oh);
        return 0;

    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}